

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O0

int32_t rcvbuf2q(NMQ *q)

{
  dlnode **ppdVar1;
  uint32_t uVar2;
  segment *seg;
  segment *s;
  dlnode *nxt;
  dlnode *node;
  int32_t tot;
  NMQ *q_local;
  
  node._4_4_ = 0;
  nxt = (q->rcv_buf).next;
  s = (segment *)nxt->next;
  while ((nxt != &q->rcv_buf && (*(uint32_t *)&nxt[2].next == q->rcv_nxt))) {
    ppdVar1 = q->rcv_sn_to_node;
    uVar2 = modsn(*(uint32_t *)&nxt[2].next,q->MAX_RCV_BUF_NUM);
    ppdVar1[uVar2] = (dlnode *)0x0;
    q->nrcv_que = q->nrcv_que + 1;
    q->nrcv_buf = q->nrcv_buf - 1;
    q->rcv_nxt = q->rcv_nxt + 1;
    dlist_remove_node(nxt);
    dlist_add_tail(&q->rcv_que,nxt);
    node._4_4_ = *(int *)&nxt[3].next + node._4_4_;
    nxt = &s->head;
    s = (segment *)(s->head).next;
  }
  return node._4_4_;
}

Assistant:

static int32_t rcvbuf2q(NMQ *q) {
    int32_t tot = 0;
    dlnode *node = 0, *nxt = 0;
    FOR_EACH(node, nxt, &q->rcv_buf) {
        segment *s = ADDRESS_FOR(segment, head, node);
        if (s->sn == q->rcv_nxt) {
            q->rcv_sn_to_node[modsn(s->sn, q->MAX_RCV_BUF_NUM)] = NULL;
            segment *seg = ADDRESS_FOR(segment, head, node);
            q->nrcv_que++;
            q->nrcv_buf--;
            q->rcv_nxt++;
            dlist_remove_node(node);
            dlist_add_tail(&q->rcv_que, node);
            tot += seg->len;
        } else {
            break;
        }
    }
    return tot;
}